

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  int iVar4;
  allocator<char> local_131;
  ModelLoader loader;
  KinDynComputations model;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string modelPath;
  parser cmd;
  
  cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cmd.options._M_t._M_impl.super__Rb_tree_header._M_header;
  cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cmd.ftr._M_dataplus._M_p = (pointer)&cmd.ftr.field_2;
  cmd.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmd.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmd.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmd.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmd.ftr._M_string_length = 0;
  cmd.ftr.field_2._M_local_buf[0] = '\0';
  cmd.prog_name._M_dataplus._M_p = (pointer)&cmd.prog_name.field_2;
  cmd.prog_name._M_string_length = 0;
  cmd.prog_name.field_2._M_local_buf[0] = '\0';
  cmd.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmd.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmd.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmd.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmd.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmd.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  addOptions(&cmd);
  cmdline::parser::parse_check(&cmd,argc,argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&model,"model",(allocator<char> *)&local_108);
  pbVar2 = cmdline::parser::get<std::__cxx11::string>(&cmd,(string *)&model);
  std::__cxx11::string::string((string *)&modelPath,(string *)pbVar2);
  std::__cxx11::string::~string((string *)&model);
  iDynTree::ModelLoader::ModelLoader(&loader);
  std::__cxx11::string::string<std::allocator<char>>((string *)&model,"urdf",&local_131);
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = iDynTree::ModelLoader::loadModelFromFile
                    ((string *)&loader,(string *)&modelPath,(vector *)&model);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::__cxx11::string::~string((string *)&model);
  iDynTree::KinDynComputations::KinDynComputations(&model);
  if (cVar1 != '\0') {
    iDynTree::ModelLoader::model();
    cVar1 = iDynTree::KinDynComputations::loadRobotModel((Model *)&model);
    if (cVar1 != '\0') {
      handlePrintOption(&model,&cmd);
      handleTotalMassOptions(&model,&cmd);
      handleLinkCOMOptions(&model,&cmd);
      iVar4 = 0;
      handleFramePoseOptions(&model,&cmd);
      goto LAB_001052e8;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Impossible to read model at file ");
  poVar3 = std::operator<<(poVar3,(string *)&modelPath);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
LAB_001052e8:
  iDynTree::KinDynComputations::~KinDynComputations(&model);
  iDynTree::ModelLoader::~ModelLoader(&loader);
  std::__cxx11::string::~string((string *)&modelPath);
  cmdline::parser::~parser(&cmd);
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    cmdline::parser cmd;
    addOptions(cmd);
    cmd.parse_check(argc, argv);

    // Read model
    std::string modelPath = cmd.get<std::string>("model");
    iDynTree::ModelLoader loader;
    bool ok = loader.loadModelFromFile(modelPath);
    iDynTree::KinDynComputations model;
    if( !ok || !model.loadRobotModel(loader.model()))
    {
        std::cerr << "Impossible to read model at file " << modelPath << std::endl;
        return EXIT_FAILURE;
    }

    // Handle print option
    handlePrintOption(model,cmd);

    // Handle total mass option
    handleTotalMassOptions(model,cmd);

    // Handle link com
    handleLinkCOMOptions(model,cmd);

    // Handle frame pose
    handleFramePoseOptions(model,cmd);


    return EXIT_SUCCESS;
}